

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

Utest * __thiscall
TEST_DoublingFactorCounterTest_Not_TwoSetsOfIdenticalSequences_Open_TestShell::createTest
          (TEST_DoublingFactorCounterTest_Not_TwoSetsOfIdenticalSequences_Open_TestShell *this)

{
  TEST_DoublingFactorCounterTest_Not_TwoSetsOfIdenticalSequences_Open_Test *this_00;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  TEST_DoublingFactorCounterTest_Not_TwoSetsOfIdenticalSequences_Open_TestShell *this_local;
  
  this_00 = (TEST_DoublingFactorCounterTest_Not_TwoSetsOfIdenticalSequences_Open_Test *)
            operator_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
  TEST_DoublingFactorCounterTest_Not_TwoSetsOfIdenticalSequences_Open_Test::
  TEST_DoublingFactorCounterTest_Not_TwoSetsOfIdenticalSequences_Open_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, Not_TwoSetsOfIdenticalSequences_Open)
{
	addPair(Tile::WestWind);
	addSequence(Tile::TwoOfCharacters, false);
	addSequence(Tile::TwoOfCharacters, false);
	addSequence(Tile::ThreeOfCircles, false);
	addSequence(Tile::ThreeOfCircles, true);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::TwoSetsOfIdenticalSequences));
}